

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

HelperCallOpnd *
Lowerer::CreateHelperCallOpnd(JnHelperMethod helperMethod,int helperArgCount,Func *func)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  HelperCallOpnd *local_20;
  HelperCallOpnd *helperCallOpnd;
  Func *func_local;
  int helperArgCount_local;
  JnHelperMethod helperMethod_local;
  
  if (func == (Func *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x615b,"(func)","func");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if ((((DAT_01ea9eec & 1) == 0) || (bVar2 = Func::IsJitInDebugMode(func), !bVar2)) ||
     (bVar2 = HelperMethodAttributes::CanThrow(helperMethod), !bVar2)) {
    local_20 = IR::HelperCallOpnd::New(helperMethod,func);
  }
  else {
    local_20 = &IR::DiagHelperCallOpnd::New(helperMethod,func,helperArgCount)->super_HelperCallOpnd;
  }
  return local_20;
}

Assistant:

IR::HelperCallOpnd*
Lowerer::CreateHelperCallOpnd(IR::JnHelperMethod helperMethod, int helperArgCount, Func* func)
{
    Assert(func);

    IR::HelperCallOpnd* helperCallOpnd;
    if (CONFIG_FLAG(EnableContinueAfterExceptionWrappersForHelpers) &&
        func->IsJitInDebugMode() &&
        HelperMethodAttributes::CanThrow(helperMethod))
    {
        // Create DiagHelperCallOpnd to indicate that it's needed to wrap original helper with try-catch wrapper,
        // so that we can ignore exception and bailout to next stmt in debugger.
        // For details, see: Lib\Runtime\Debug\DiagHelperMethodWrapper.{h,cpp}.
        helperCallOpnd = IR::DiagHelperCallOpnd::New(helperMethod, func, helperArgCount);
    }
    else
    {
         helperCallOpnd = IR::HelperCallOpnd::New(helperMethod, func);
    }

    return helperCallOpnd;
}